

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  size_t sVar4;
  char cVar5;
  int i;
  int iVar6;
  char local_3c [4];
  int local_38;
  char buff [4];
  int val;
  int val_1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar6 = 0;
  do {
    pcVar2 = (s->_M_dataplus)._M_p;
    cVar1 = pcVar2[iVar6];
    cVar5 = (char)__return_storage_ptr__;
    if (cVar1 == '%') {
      if (pcVar2[(long)iVar6 + 1] == 'u') {
        local_38 = 0;
        bVar3 = from_hex_to_i(s,iVar6 + 2,4,&local_38);
        if (bVar3) {
          sVar4 = to_utf8(local_38,local_3c);
          if (sVar4 != 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_3c);
          }
          iVar6 = iVar6 + 5;
        }
        else {
          std::__cxx11::string::push_back(cVar5);
        }
      }
      else {
        buff[0] = '\0';
        buff[1] = '\0';
        buff[2] = '\0';
        buff[3] = '\0';
        bVar3 = from_hex_to_i(s,iVar6 + 1,2,(int *)buff);
        if (bVar3) {
          std::__cxx11::string::push_back(cVar5);
          iVar6 = iVar6 + 2;
        }
        else {
          std::__cxx11::string::push_back(cVar5);
        }
      }
    }
    else {
      if ((cVar1 != '+') && (cVar1 == '\0')) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back(cVar5);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (int i = 0; s[i]; i++) {
        if (s[i] == '%') {
            if (s[i + 1] && s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}